

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O3

bool __thiscall LinkedObjectFile::is_empty_list(LinkedObjectFile *this,int seg,int byte_idx)

{
  pointer pvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if ((byte_idx & 3U) != 0) {
    __assert_fail("(byte_idx % 4) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFile.cpp"
                  ,0x2aa,"bool LinkedObjectFile::is_empty_list(int, int)");
  }
  uVar4 = (ulong)seg;
  pvVar1 = (this->words_by_seg).
           super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->words_by_seg).
                 super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  uVar5 = uVar4;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    uVar5 = (ulong)(byte_idx >> 2);
    lVar2 = *(long *)&pvVar1[uVar4].super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>.
                      _M_impl.super__Vector_impl_data;
    uVar3 = ((long)*(pointer *)
                    ((long)&pvVar1[uVar4].
                            super__Vector_base<LinkedWord,_std::allocator<LinkedWord>_>._M_impl.
                            super__Vector_impl_data + 8) - lVar2 >> 4) * -0x5555555555555555;
    if (uVar5 <= uVar3 && uVar3 - uVar5 != 0) {
      return *(int *)(lVar2 + uVar5 * 0x30) == 5;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5,uVar3
            );
}

Assistant:

bool LinkedObjectFile::is_empty_list(int seg, int byte_idx) {
  assert((byte_idx % 4) == 0);
  auto& word = words_by_seg.at(seg).at(byte_idx / 4);
  return word.kind == LinkedWord::EMPTY_PTR;
}